

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O0

int Cec_ManSimClassesPrepare(Cec_ManSim_t *p,int LevelMax)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Rpr_t *pGVar4;
  int *piVar5;
  bool bVar6;
  float Mem;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  int LevelMax_local;
  Cec_ManSim_t *p_local;
  
  if (p->pAig->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                  ,0x357,"int Cec_ManSimClassesPrepare(Cec_ManSim_t *, int)");
  }
  iVar2 = Gia_ManObjNum(p->pAig);
  pGVar4 = (Gia_Rpr_t *)calloc((long)iVar2,4);
  p->pAig->pReprs = pGVar4;
  iVar2 = Gia_ManObjNum(p->pAig);
  piVar5 = (int *)calloc((long)iVar2,4);
  p->pAig->pNexts = piVar5;
  Gia_ManCreateValueRefs(p->pAig);
  if (p->pPars->fLatchCorr == 0) {
    if (LevelMax == -1) {
      local_2c = 0;
      while( true ) {
        bVar6 = false;
        if (local_2c < p->pAig->nObjs) {
          pGStack_28 = Gia_ManObj(p->pAig,local_2c);
          bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        pGVar1 = p->pAig;
        iVar3 = Gia_ObjIsAnd(pGStack_28);
        iVar2 = 0xfffffff;
        if (iVar3 != 0) {
          iVar2 = 0;
        }
        Gia_ObjSetRepr(pGVar1,local_2c,iVar2);
        local_2c = local_2c + 1;
      }
    }
    else {
      Gia_ManLevelNum(p->pAig);
      local_2c = 0;
      while( true ) {
        bVar6 = false;
        if (local_2c < p->pAig->nObjs) {
          pGStack_28 = Gia_ManObj(p->pAig,local_2c);
          bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        pGVar1 = p->pAig;
        iVar2 = Gia_ObjIsAnd(pGStack_28);
        bVar6 = false;
        if (iVar2 != 0) {
          iVar2 = Gia_ObjLevel(p->pAig,pGStack_28);
          bVar6 = iVar2 <= LevelMax;
        }
        iVar2 = 0xfffffff;
        if (bVar6) {
          iVar2 = 0;
        }
        Gia_ObjSetRepr(pGVar1,local_2c,iVar2);
        local_2c = local_2c + 1;
      }
      Vec_IntFreeP(&p->pAig->vLevels);
    }
  }
  else {
    local_2c = 0;
    while( true ) {
      bVar6 = false;
      if (local_2c < p->pAig->nObjs) {
        pGStack_28 = Gia_ManObj(p->pAig,local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      Gia_ObjSetRepr(p->pAig,local_2c,0xfffffff);
      local_2c = local_2c + 1;
    }
  }
  if (p->pPars->fSeqSimulate != 0) {
    local_2c = 0;
    while( true ) {
      iVar2 = Gia_ManRegNum(p->pAig);
      bVar6 = false;
      if (local_2c < iVar2) {
        pGVar1 = p->pAig;
        iVar2 = Gia_ManPiNum(p->pAig);
        pGStack_28 = Gia_ManCi(pGVar1,iVar2 + local_2c);
        bVar6 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      if (pGStack_28->Value != 0) {
        pGVar1 = p->pAig;
        iVar2 = Gia_ObjId(p->pAig,pGStack_28);
        Gia_ObjSetRepr(pGVar1,iVar2,0);
      }
      local_2c = local_2c + 1;
    }
  }
  p->nWords = 1;
  do {
    if (p->pPars->fVerbose != 0) {
      pGVar1 = p->pAig;
      Mem = Cec_MemUsage(p);
      Gia_ManEquivPrintClasses(pGVar1,0,Mem);
    }
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
      iVar2 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar2 != 0) {
        return 1;
      }
    }
    p->nWords = p->nWords * 2 + 1;
  } while (p->nWords <= p->pPars->nWords);
  return 0;
}

Assistant:

int Cec_ManSimClassesPrepare( Cec_ManSim_t * p, int LevelMax )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pAig->pReprs == NULL );
    // allocate representation
    p->pAig->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p->pAig) );
    p->pAig->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    // create references
    Gia_ManCreateValueRefs( p->pAig );
    // set starting representative of internal nodes to be constant 0
    if ( p->pPars->fLatchCorr )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
    else if ( LevelMax == -1 )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjIsAnd(pObj) ? 0 : GIA_VOID );
    else
    {
        Gia_ManLevelNum( p->pAig );
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, (Gia_ObjIsAnd(pObj) && Gia_ObjLevel(p->pAig,pObj) <= LevelMax) ? 0 : GIA_VOID );
        Vec_IntFreeP( &p->pAig->vLevels );
    }
    // if sequential simulation, set starting representative of ROs to be constant 0
    if ( p->pPars->fSeqSimulate )
        Gia_ManForEachRo( p->pAig, pObj, i )
            if ( pObj->Value )
                Gia_ObjSetRepr( p->pAig, Gia_ObjId(p->pAig, pObj), 0 );
    // perform simulation
    p->nWords = 1;
    do {
        if ( p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        for ( i = 0; i < 4; i++ )
        {
            Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
            if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
                return 1;
        }
        p->nWords = 2 * p->nWords + 1;
    }
    while ( p->nWords <= p->pPars->nWords );
    return 0;
}